

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O3

void rr::anon_unknown_19::transformVertexClipCoordsToWindowCoords
               (RenderState *state,VertexPacket *packet)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  fVar1 = (packet->position).m_data[3];
  auVar7._12_4_ = 0x3f800000;
  auVar7._0_12_ = *(undefined1 (*) [12])(packet->position).m_data;
  auVar8._4_4_ = fVar1;
  auVar8._0_4_ = fVar1;
  auVar8._8_4_ = fVar1;
  auVar8._12_4_ = fVar1;
  auVar8 = divps(auVar7,auVar8);
  *(undefined1 (*) [16])(packet->position).m_data = auVar8;
  fVar1 = (state->viewport).zn;
  fVar2 = (state->viewport).zf;
  uVar3 = (state->viewport).rect.width;
  uVar5 = (state->viewport).rect.height;
  uVar4 = (state->viewport).rect.left;
  uVar6 = (state->viewport).rect.bottom;
  *(ulong *)(packet->position).m_data =
       CONCAT44((float)(int)uVar5 * 0.5 * auVar8._4_4_ + (float)(int)uVar6 + (float)(int)uVar5 * 0.5
                ,(float)(int)uVar3 * 0.5 * auVar8._0_4_ +
                 (float)(int)uVar4 + (float)(int)uVar3 * 0.5);
  (packet->position).m_data[2] = (fVar1 + fVar2) * 0.5 + auVar8._8_4_ * (fVar2 - fVar1) * 0.5;
  (packet->position).m_data[3] = auVar8._12_4_;
  return;
}

Assistant:

void transformVertexClipCoordsToWindowCoords (const RenderState& state, VertexPacket& packet)
{
	// To normalized device coords
	{
		packet.position = tcu::Vec4(packet.position.x()/packet.position.w(),
									packet.position.y()/packet.position.w(),
									packet.position.z()/packet.position.w(),
									1.0f               /packet.position.w());
	}

	// To window coords
	{
		const WindowRectangle&	viewport	= state.viewport.rect;
		const float				halfW		= (float)(viewport.width) / 2.0f;
		const float				halfH		= (float)(viewport.height) / 2.0f;
		const float				oX			= (float)viewport.left + halfW;
		const float				oY			= (float)viewport.bottom + halfH;
		const float				zn			= state.viewport.zn;
		const float				zf			= state.viewport.zf;

		packet.position = tcu::Vec4(packet.position.x()*halfW + oX,
									packet.position.y()*halfH + oY,
									packet.position.z()*(zf - zn)/2.0f + (zn + zf)/2.0f,
									packet.position.w());
	}
}